

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageView::PageView(PageView *this,QWidget *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PageViewPrivate *this_00;
  ConnectionType type;
  undefined1 auVar5 [16];
  code *local_68;
  undefined8 uStack_60;
  QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
  *local_58;
  PageViewPrivate *local_50;
  Object local_48 [8];
  Object local_40 [8];
  Connection local_38 [8];
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a81c0;
  *(undefined ***)&this->field_0x10 = &PTR__PageView_001a8378;
  this_00 = (PageViewPrivate *)operator_new(0x60);
  PageViewPrivate::PageViewPrivate(this_00,this);
  local_58 = &this->d;
  (this->d).d = this_00;
  local_68 = _q_currentIndexChanged;
  uStack_60._0_4_ = 0;
  uStack_60._4_4_ = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::PageControl::*)(int,int),void(QtMWidgets::PageView::*)(int,int)>
            ((Object *)local_38,(offset_in_PageControl_to_subr)this_00->control,
             (Object *)PageControl::currentChanged,0,type);
  QMetaObject::Connection::~Connection(local_38);
  local_68 = _q_normalizePageAnimation;
  uStack_60._0_4_ = 0;
  uStack_60._4_4_ = 0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::PageView::*)(QVariant_const&)>
            (local_40,(offset_in_QVariantAnimation_to_subr)((this->d).d)->normalizeAnimation,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_68 = _q_normalizeAnimationFinished;
  uStack_60._0_4_ = 0;
  uStack_60._4_4_ = 0;
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::PageView::*)()>
            (local_48,(offset_in_QAbstractAnimation_to_subr)((this->d).d)->normalizeAnimation,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_50 = (this->d).d;
  auVar5 = QFrame::frameRect();
  iVar1 = QFrame::frameWidth();
  iVar2 = QFrame::frameWidth();
  iVar3 = QFrame::frameWidth();
  iVar4 = QFrame::frameWidth();
  local_68._0_4_ = iVar1 + auVar5._0_4_;
  uStack_60._0_4_ = auVar5._8_4_ - iVar3;
  local_68._4_4_ = iVar2 + auVar5._4_4_;
  uStack_60._4_4_ = auVar5._12_4_ - iVar4;
  PageViewPrivate::relayoutChildren(local_50,(QRect *)&local_68);
  QWidget::raise();
  QWidget::show();
  return;
}

Assistant:

PageView::PageView( QWidget * parent )
	:	QFrame( parent )
	,	d( new PageViewPrivate( this ) )
{
	connect( d->control, &PageControl::currentChanged,
		this, &PageView::_q_currentIndexChanged );

	connect( d->normalizeAnimation, &QVariantAnimation::valueChanged,
		this, &PageView::_q_normalizePageAnimation );

	connect( d->normalizeAnimation, &QVariantAnimation::finished,
		this, &PageView::_q_normalizeAnimationFinished );

	d->relayoutChildren( frameRect().adjusted( frameWidth(), frameWidth(),
		-frameWidth(), -frameWidth() ) );

	d->control->raise();

	d->control->show();
}